

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O0

VectorXd __thiscall CppCNN::flatten_layer(CppCNN *this,LayerValues *input)

{
  bool bVar1;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Index IVar2;
  size_type sVar3;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_RDX;
  Index extraout_RDX;
  VectorXd VVar4;
  SegmentReturnType local_b8;
  undefined1 local_70 [8];
  MatrixXd c_value;
  Matrix<double,__1,__1,_0,__1,__1> *c;
  const_iterator __end1;
  const_iterator __begin1;
  LayerValues *__range1;
  Index start;
  undefined1 local_21;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_20;
  LayerValues *input_local;
  CppCNN *this_local;
  VectorXd *v_flatten;
  
  local_21 = 0;
  local_20 = in_RDX;
  input_local = input;
  this_local = this;
  this_00 = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::operator[](in_RDX,0);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size(this_00);
  sVar3 = std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(local_20);
  start = IVar2 * sVar3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(unsigned_long *)&start);
  __range1 = (LayerValues *)0x0;
  __end1 = std::
           vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::begin(local_20);
  c = (Matrix<double,__1,__1,_0,__1,__1> *)
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::end(local_20);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                     *)&c), bVar1) {
    c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)__gnu_cxx::
                __normal_iterator<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::operator*(&__end1);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_70,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transposeInPlace
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70,IVar2,1);
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment
              (&local_b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(Index)__range1,
               IVar2);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_b8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    __range1 = (LayerValues *)
               ((long)&(__range1->
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + IVar2);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_70)
    ;
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
    ::operator++(&__end1);
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd CppCNN::flatten_layer(const LayerValues& input) {
	VectorXd v_flatten(input[0].size() * input.size());
	Index start = 0;
	for (auto& c : input) {
		MatrixXd c_value = c;
		c_value.transposeInPlace();
		c_value.resize(c.size(), 1);
		v_flatten.segment(start, c_value.size())= c_value;
		start += c_value.size();
	}
	return v_flatten;
}